

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3_str_reset(StrAccum *p)

{
  if ((p->printfFlags & 4) != 0) {
    sqlite3DbFree(p->db,p->zText);
    p->printfFlags = p->printfFlags & 0xfb;
  }
  p->nAlloc = 0;
  p->nChar = 0;
  p->zText = (char *)0x0;
  return;
}

Assistant:

SQLITE_API void sqlite3_str_reset(StrAccum *p){
  if( isMalloced(p) ){
    sqlite3DbFree(p->db, p->zText);
    p->printfFlags &= ~SQLITE_PRINTF_MALLOCED;
  }
  p->nAlloc = 0;
  p->nChar = 0;
  p->zText = 0;
}